

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O0

void __thiscall HTTP::Tick(HTTP *this,double timeout)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string local_90 [32];
  long local_70;
  size_t startcontent;
  string local_38;
  double local_18;
  double timeout_local;
  HTTP *this_local;
  
  local_18 = timeout;
  timeout_local = (double)this;
  bVar1 = Client::Select(this->client,timeout);
  if (bVar1) {
    Client::Recv_abi_cxx11_(&local_38,this->client,0x2000);
    std::__cxx11::string::operator+=((string *)&this->response,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Client::Connected(this->client);
  if (!bVar1) {
    uVar3 = std::__cxx11::string::length();
    if (0xc < uVar3) {
      std::__cxx11::string::substr((ulong)&startcontent,(ulong)&this->response);
      iVar2 = util::to_int((string *)&startcontent);
      this->status = iVar2;
      std::__cxx11::string::~string((string *)&startcontent);
    }
    local_70 = std::__cxx11::string::find((char *)&this->response,0x251cc8);
    if (local_70 == -1) {
      std::__cxx11::string::operator=((string *)&this->response,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_90,(ulong)&this->response);
      std::__cxx11::string::operator=((string *)&this->response,local_90);
      std::__cxx11::string::~string(local_90);
    }
    this->done = true;
  }
  return;
}

Assistant:

void HTTP::Tick(double timeout)
{
	if (this->client->Select(timeout))
	{
		this->response += this->client->Recv(8192);
	}

	if (!this->client->Connected())
	{
		if (this->response.length() > 12)
		{
			this->status = util::to_int(this->response.substr(9,3));
		}

		std::size_t startcontent = this->response.find("\r\n\r\n");

		if (startcontent == std::string::npos)
		{
			this->response = "";
		}
		else
		{
			this->response = this->response.substr(startcontent+4);
		}

		this->done = true;
	}
}